

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::anon_unknown_6::LineBuffer::LineBuffer(LineBuffer *this,Compressor *comp)

{
  Format FVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Compressor *in_stack_ffffffffffffffd0;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  in_RDI[4] = in_RSI;
  FVar1 = defaultFormat(in_stack_ffffffffffffffd0);
  *(Format *)(in_RDI + 5) = FVar1;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0xffffffff;
  *(undefined1 *)(in_RDI + 6) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 7));
  IlmThread_2_5::Semaphore::Semaphore((Semaphore *)(in_RDI + 0xb),1);
  return;
}

Assistant:

LineBuffer::LineBuffer (Compressor *comp) :
    dataPtr (0),
    dataSize (0),
    compressor (comp),
    partiallyFull (false),
    hasException (false),
    exception (),
    _sem (1)
{
    // empty
}